

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

void __thiscall
leveldb::log::LogTest_TruncatedTrailingRecordIsIgnored_Test::
LogTest_TruncatedTrailingRecordIsIgnored_Test(LogTest_TruncatedTrailingRecordIsIgnored_Test *this)

{
  LogTest::LogTest(&this->super_LogTest);
  (this->super_LogTest).super_Test._vptr_Test = (_func_int **)&PTR__LogTest_0014a320;
  return;
}

Assistant:

TEST_F(LogTest, TruncatedTrailingRecordIsIgnored) {
  Write("foo");
  ShrinkSize(4);  // Drop all payload as well as a header byte
  ASSERT_EQ("EOF", Read());
  // Truncated last record is ignored, not treated as an error.
  ASSERT_EQ(0, DroppedBytes());
  ASSERT_EQ("", ReportMessage());
}